

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

int xc_number_of_functionals(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  piVar3 = &xc_functional_keys[0].number;
  iVar2 = -1;
  do {
    iVar2 = iVar2 + 1;
    iVar1 = *piVar3;
    piVar3 = piVar3 + 0x41;
  } while (iVar1 != -1);
  return iVar2;
}

Assistant:

int xc_number_of_functionals(void)
{
  int num;

  for(num=0;;num++){
    if(xc_functional_keys[num].number == -1)
      return num;
  }

  fprintf(stderr, "Internal error in functionals.c\n");
  exit(1);
}